

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O3

int CfdGetTxIn(void *handle,int net_type,char *tx_hex_string,uint32_t index,char **txid,
              uint32_t *vout,uint32_t *sequence,char **script_sig)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  CfdException *this;
  char *work_txid;
  Txid temp_txid;
  Script temp_unlocking_script;
  TxInReference ref;
  TransactionContext tx;
  bool local_2e9;
  Script local_2e8;
  char *local_2b0;
  Txid local_2a8;
  undefined8 local_288;
  Script local_280;
  undefined1 local_248 [16];
  char local_238 [24];
  uint32_t local_220;
  Script local_218;
  uint32_t local_1e0;
  ConfidentialTxInReference local_190;
  
  local_2b0 = (char *)0x0;
  local_288 = 0;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(tx_hex_string);
  if (!bVar1) {
    local_2e9 = false;
    cfd::capi::ConvertNetType(net_type,&local_2e9);
    cfd::core::Txid::Txid(&local_2a8);
    cfd::core::Script::Script(&local_280);
    if (local_2e9 == true) {
      std::__cxx11::string::string((string *)local_248,tx_hex_string,(allocator *)&local_2e8);
      cfd::TransactionContext::TransactionContext
                ((TransactionContext *)&local_190,(string *)local_248);
      if ((char *)local_248._0_8_ != local_238) {
        operator_delete((void *)local_248._0_8_);
      }
      cfd::core::Transaction::GetTxIn((TxInReference *)local_248,(Transaction *)&local_190,index);
      cfd::core::Txid::Txid((Txid *)&local_2e8,(Txid *)(local_248 + 8));
      cfd::core::Txid::operator=(&local_2a8,(Txid *)&local_2e8);
      local_2e8._vptr_Script = (_func_int **)&PTR__Txid_00723450;
      if (local_2e8.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2e8.script_data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      cfd::core::Script::Script(&local_2e8,&local_218);
      cfd::core::Script::operator=(&local_280,&local_2e8);
      cfd::core::Script::~Script(&local_2e8);
      if (vout != (uint32_t *)0x0) {
        *vout = local_220;
      }
      if (sequence != (uint32_t *)0x0) {
        *sequence = local_1e0;
      }
      cfd::core::AbstractTxInReference::~AbstractTxInReference((AbstractTxInReference *)local_248);
      cfd::TransactionContext::~TransactionContext((TransactionContext *)&local_190);
    }
    else {
      std::__cxx11::string::string((string *)&local_190,tx_hex_string,(allocator *)&local_2e8);
      cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
                ((ConfidentialTransactionContext *)local_248,(string *)&local_190);
      if ((ByteData *)local_190.super_AbstractTxInReference._vptr_AbstractTxInReference !=
          &local_190.super_AbstractTxInReference.txid_.data_) {
        operator_delete(local_190.super_AbstractTxInReference._vptr_AbstractTxInReference);
      }
      cfd::core::ConfidentialTransaction::GetTxIn
                (&local_190,(ConfidentialTransaction *)local_248,index);
      cfd::core::Txid::Txid((Txid *)&local_2e8,&local_190.super_AbstractTxInReference.txid_);
      cfd::core::Txid::operator=(&local_2a8,(Txid *)&local_2e8);
      local_2e8._vptr_Script = (_func_int **)&PTR__Txid_00723450;
      if (local_2e8.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2e8.script_data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      cfd::core::Script::Script(&local_2e8,&local_190.super_AbstractTxInReference.unlocking_script_)
      ;
      cfd::core::Script::operator=(&local_280,&local_2e8);
      cfd::core::Script::~Script(&local_2e8);
      if (vout != (uint32_t *)0x0) {
        *vout = local_190.super_AbstractTxInReference.vout_;
      }
      if (sequence != (uint32_t *)0x0) {
        *sequence = local_190.super_AbstractTxInReference.sequence_;
      }
      cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference(&local_190);
      cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
                ((ConfidentialTransactionContext *)local_248);
    }
    if (txid == (char **)0x0) {
      pcVar2 = (char *)0x0;
    }
    else {
      cfd::core::Txid::GetHex_abi_cxx11_((string *)&local_190,&local_2a8);
      pcVar2 = cfd::capi::CreateString((string *)&local_190);
      local_2b0 = pcVar2;
      if ((ByteData *)local_190.super_AbstractTxInReference._vptr_AbstractTxInReference !=
          &local_190.super_AbstractTxInReference.txid_.data_) {
        operator_delete(local_190.super_AbstractTxInReference._vptr_AbstractTxInReference);
      }
    }
    if (script_sig == (char **)0x0) {
      pcVar3 = (char *)0x0;
    }
    else {
      cfd::core::Script::GetHex_abi_cxx11_((string *)&local_190,&local_280);
      pcVar3 = cfd::capi::CreateString((string *)&local_190);
      if ((ByteData *)local_190.super_AbstractTxInReference._vptr_AbstractTxInReference !=
          &local_190.super_AbstractTxInReference.txid_.data_) {
        operator_delete(local_190.super_AbstractTxInReference._vptr_AbstractTxInReference);
      }
    }
    if (pcVar2 != (char *)0x0) {
      *txid = pcVar2;
    }
    if (pcVar3 != (char *)0x0) {
      *script_sig = pcVar3;
    }
    cfd::core::Script::~Script(&local_280);
    local_2a8._vptr_Txid = (_func_int **)&PTR__Txid_00723450;
    if (local_2a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2a8.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return 0;
  }
  local_190.super_AbstractTxInReference._vptr_AbstractTxInReference = (_func_int **)0x5e44da;
  local_190.super_AbstractTxInReference.txid_._vptr_Txid._0_4_ = 0x9b7;
  local_190.super_AbstractTxInReference.txid_.data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = "CfdGetTxIn";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)&local_190,kCfdLogLevelWarning,"tx is null or empty.");
  this = (CfdException *)__cxa_allocate_exception(0x30);
  local_190.super_AbstractTxInReference._vptr_AbstractTxInReference =
       (_func_int **)&local_190.super_AbstractTxInReference.txid_.data_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_190,"Failed to parameter. tx is null or empty.","");
  cfd::core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)&local_190);
  __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetTxIn(
    void* handle, int net_type, const char* tx_hex_string, uint32_t index,
    char** txid, uint32_t* vout, uint32_t* sequence, char** script_sig) {
  char* work_txid = nullptr;
  char* work_script_sig = nullptr;
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }

    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);
    Txid temp_txid;
    Script temp_unlocking_script;
    if (is_bitcoin) {
      TransactionContext tx(tx_hex_string);
      const TxInReference ref = tx.GetTxIn(index);
      temp_txid = ref.GetTxid();
      temp_unlocking_script = ref.GetUnlockingScript();
      if (vout != nullptr) *vout = ref.GetVout();
      if (sequence != nullptr) *sequence = ref.GetSequence();
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext tx(tx_hex_string);
      const ConfidentialTxInReference ref = tx.GetTxIn(index);
      temp_txid = ref.GetTxid();
      temp_unlocking_script = ref.GetUnlockingScript();
      if (vout != nullptr) *vout = ref.GetVout();
      if (sequence != nullptr) *sequence = ref.GetSequence();
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    if (txid != nullptr) {
      work_txid = CreateString(temp_txid.GetHex());
    }
    if (script_sig != nullptr) {
      work_script_sig = CreateString(temp_unlocking_script.GetHex());
    }

    if (work_txid != nullptr) *txid = work_txid;
    if (work_script_sig != nullptr) *script_sig = work_script_sig;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_txid, &work_script_sig);
  return result;
}